

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribute.c
# Opt level: O2

int distribute_start(mixed_segment *segment)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  uint32_t i;
  ulong uVar6;
  
  plVar2 = (long *)segment->data;
  puVar3 = (undefined8 *)plVar2[2];
  if (puVar3 == (undefined8 *)0x0) {
    mixed_err(0x16);
    iVar5 = 0;
  }
  else {
    uVar1 = *(uint *)(plVar2 + 1);
    for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
      puVar4 = *(undefined8 **)(*plVar2 + uVar6 * 8);
      *puVar4 = *puVar3;
      puVar4[1] = puVar3[1];
      *(undefined4 *)(puVar4 + 2) = *(undefined4 *)(puVar3 + 2);
    }
    *(undefined4 *)(plVar2 + 3) = 0;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int distribute_start(struct mixed_segment *segment){
  struct distribute_data *data = (struct distribute_data *)segment->data;
  struct mixed_buffer *in = data->in;

  if(!in){
    mixed_err(MIXED_BUFFER_MISSING);
    return 0;
  }

  for(uint32_t i=0; i<data->count; ++i){
    struct mixed_buffer *buffer = data->out[i];
    buffer->_data = in->_data;
    buffer->size = in->size;
    buffer->read = in->read;
    buffer->write = in->write;
  }

  data->was_available = 0;
  return 1;
}